

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmimeprovider.cpp
# Opt level: O0

const_iterator __thiscall
QMimeBinaryProvider::loadMimeTypeExtra(QMimeBinaryProvider *this,QString *mimeName)

{
  QLatin1StringView str;
  QLatin1StringView str_00;
  QLatin1StringView str_01;
  QStringView s;
  QLatin1StringView other;
  QAnyStringView qualifiedName;
  QAnyStringView qualifiedName_00;
  QAnyStringView qualifiedName_01;
  bool bVar1;
  uint uVar2;
  int iVar3;
  pointer ppVar4;
  QDebug *this_00;
  undefined1 uVar5;
  int __oflag;
  long in_FS_OFFSET;
  QStringBuilder<QString_&,_char16_t> QVar6;
  pair<std::_Rb_tree_iterator<std::pair<const_QString,_QMimeBinaryProvider::MimeTypeExtra>_>,_bool>
  pVar7;
  QStringView QVar8;
  QStringView QVar9;
  iterator iVar10;
  MimeTypeExtra *extra;
  QString pattern;
  QString text;
  QString lang;
  QStringView tag;
  QStringView name;
  QXmlStreamReader xml;
  QString mainPattern;
  QFile qfile;
  QString mimeFile;
  iterator it;
  undefined4 in_stack_fffffffffffffb28;
  OpenModeFlag in_stack_fffffffffffffb2c;
  undefined4 in_stack_fffffffffffffb30;
  CaseSensitivity in_stack_fffffffffffffb34;
  QStringBuilder<QStringBuilder<QString_&,_char16_t>,_QString> *in_stack_fffffffffffffb38;
  undefined7 in_stack_fffffffffffffb40;
  undefined1 in_stack_fffffffffffffb47;
  undefined6 in_stack_fffffffffffffb48;
  QChar in_stack_fffffffffffffb4e;
  map<QString,_QMimeBinaryProvider::MimeTypeExtra,_std::less<QString>,_std::allocator<std::pair<const_QString,_QMimeBinaryProvider::MimeTypeExtra>_>_>
  *in_stack_fffffffffffffb50;
  QDebug *in_stack_fffffffffffffb58;
  QXmlStreamAttributes *in_stack_fffffffffffffb80;
  QDebug *in_stack_fffffffffffffb88;
  undefined1 *puVar11;
  undefined7 in_stack_fffffffffffffbb8;
  QChar local_392 [21];
  QStringView local_368;
  undefined1 *local_358;
  undefined1 *puStack_350;
  undefined1 *local_348;
  QLatin1StringView local_338;
  QLatin1StringView local_328;
  undefined1 *local_318;
  undefined1 *puStack_310;
  undefined1 *local_308;
  QStringView local_2d8;
  undefined1 *local_2c8;
  undefined1 *puStack_2c0;
  undefined1 *local_2b8;
  QLatin1StringView local_2a8;
  QStringView local_298;
  qsizetype local_288;
  storage_type_conflict *psStack_280;
  QStringView local_218;
  QLatin1StringView local_200;
  QStringView local_1f0;
  undefined1 *local_1e0;
  undefined1 *local_1d8;
  undefined1 *puStack_1d0;
  undefined1 *local_1c8;
  _Base_ptr local_1c0;
  undefined1 local_1b8;
  uint local_1ac;
  QFile local_1a8;
  QLatin1StringView local_198;
  QString *local_188;
  char16_t local_180;
  undefined2 local_172;
  QLatin1StringView local_158;
  QString *local_130;
  char16_t local_128;
  undefined2 local_11a;
  undefined1 *local_118;
  undefined1 *puStack_110;
  undefined1 *local_108;
  _Self local_f8;
  _Rb_tree_const_iterator<std::pair<const_QString,_QMimeBinaryProvider::MimeTypeExtra>_> local_f0;
  iterator local_e8;
  _Rb_tree_const_iterator<std::pair<const_QString,_QMimeBinaryProvider::MimeTypeExtra>_> local_e0;
  _Base_ptr local_d8;
  undefined1 local_d0;
  QString *local_c8;
  char16_t local_c0;
  QString *local_78;
  char16_t local_70;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_e8._M_node = (_Base_ptr)&DAT_aaaaaaaaaaaaaaaa;
  local_e8._M_node =
       (_Base_ptr)
       std::
       map<QString,_QMimeBinaryProvider::MimeTypeExtra,_std::less<QString>,_std::allocator<std::pair<const_QString,_QMimeBinaryProvider::MimeTypeExtra>_>_>
       ::find((map<QString,_QMimeBinaryProvider::MimeTypeExtra,_std::less<QString>,_std::allocator<std::pair<const_QString,_QMimeBinaryProvider::MimeTypeExtra>_>_>
               *)CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28),(key_type *)0x8fb8dc)
  ;
  std::_Rb_tree_const_iterator<std::pair<const_QString,_QMimeBinaryProvider::MimeTypeExtra>_>::
  _Rb_tree_const_iterator(&local_f0,&local_e8);
  local_f8._M_node =
       (_Base_ptr)
       std::
       map<QString,_QMimeBinaryProvider::MimeTypeExtra,_std::less<QString>,_std::allocator<std::pair<const_QString,_QMimeBinaryProvider::MimeTypeExtra>_>_>
       ::cend((map<QString,_QMimeBinaryProvider::MimeTypeExtra,_std::less<QString>,_std::allocator<std::pair<const_QString,_QMimeBinaryProvider::MimeTypeExtra>_>_>
               *)CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28));
  bVar1 = std::operator==(&local_f0,&local_f8);
  if (bVar1) {
    local_118 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_110 = &DAT_aaaaaaaaaaaaaaaa;
    local_108 = &DAT_aaaaaaaaaaaaaaaa;
    local_11a = 0x2f;
    QVar6 = ::operator+((QString *)in_stack_fffffffffffffb38,
                        (char16_t *)CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30));
    local_130 = QVar6.a;
    local_128 = QVar6.b;
    local_78 = local_130;
    local_70 = local_128;
    QString::toLower((QString *)CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28));
    ::operator+(&in_stack_fffffffffffffb38->a,
                (QString *)CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30));
    local_158 = Qt::Literals::StringLiterals::operator____L1
                          ((char *)in_stack_fffffffffffffb38,
                           CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30));
    ::operator+(in_stack_fffffffffffffb38,
                (QLatin1String *)CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30));
    ::QStringBuilder::operator_cast_to_QString
              ((QStringBuilder<QStringBuilder<QStringBuilder<QString_&,_char16_t>,_QString>,_QLatin1String>
                *)CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28));
    QStringBuilder<QStringBuilder<QStringBuilder<QString_&,_char16_t>,_QString>,_QLatin1String>::
    ~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QString_&,_char16_t>,_QString>,_QLatin1String>
                     *)0x8fba44);
    QStringBuilder<QStringBuilder<QString_&,_char16_t>,_QString>::~QStringBuilder
              ((QStringBuilder<QStringBuilder<QString_&,_char16_t>,_QString> *)0x8fba51);
    QString::~QString((QString *)0x8fba5e);
    bVar1 = QFile::exists((QString *)0x8fba6b);
    if (!bVar1) {
      local_172 = 0x2f;
      QVar6 = ::operator+((QString *)in_stack_fffffffffffffb38,
                          (char16_t *)CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30))
      ;
      local_188 = QVar6.a;
      local_180 = QVar6.b;
      local_c8 = local_188;
      local_c0 = local_180;
      ::operator+((QStringBuilder<QString_&,_char16_t> *)
                  CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30),
                  (QString *)CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28));
      local_198 = Qt::Literals::StringLiterals::operator____L1
                            ((char *)in_stack_fffffffffffffb38,
                             CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30));
      ::operator+((QStringBuilder<QStringBuilder<QString_&,_char16_t>,_const_QString_&> *)
                  CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30),
                  (QLatin1String *)CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28));
      ::QStringBuilder::operator_cast_to_QString
                ((QStringBuilder<QStringBuilder<QStringBuilder<QString_&,_char16_t>,_const_QString_&>,_QLatin1String>
                  *)CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28));
      QString::operator=((QString *)CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30),
                         (QString *)CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28));
      QString::~QString((QString *)0x8fbb92);
    }
    local_1a8.super_QFileDevice.super_QIODevice.super_QObject._vptr_QObject =
         (_func_int **)&DAT_aaaaaaaaaaaaaaaa;
    local_1a8.super_QFileDevice.super_QIODevice.super_QObject.d_ptr.d =
         (QObjectData *)&DAT_aaaaaaaaaaaaaaaa;
    QFile::QFile((QFile *)in_stack_fffffffffffffb50,
                 (QString *)CONCAT26(in_stack_fffffffffffffb4e.ucs,in_stack_fffffffffffffb48));
    QFlags<QIODeviceBase::OpenModeFlag>::QFlags
              ((QFlags<QIODeviceBase::OpenModeFlag> *)
               CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30),
               in_stack_fffffffffffffb2c);
    uVar2 = QFile::open(&local_1a8,(char *)(ulong)local_1ac,__oflag);
    if ((uVar2 & 1) == 0) {
      local_e0._M_node =
           (_Base_ptr)
           std::
           map<QString,_QMimeBinaryProvider::MimeTypeExtra,_std::less<QString>,_std::allocator<std::pair<const_QString,_QMimeBinaryProvider::MimeTypeExtra>_>_>
           ::cend((map<QString,_QMimeBinaryProvider::MimeTypeExtra,_std::less<QString>,_std::allocator<std::pair<const_QString,_QMimeBinaryProvider::MimeTypeExtra>_>_>
                   *)CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28));
      bVar1 = true;
    }
    else {
      pVar7 = std::
              map<QString,_QMimeBinaryProvider::MimeTypeExtra,_std::less<QString>,_std::allocator<std::pair<const_QString,_QMimeBinaryProvider::MimeTypeExtra>_>_>
              ::try_emplace<>(in_stack_fffffffffffffb50,
                              (key_type *)
                              CONCAT26(in_stack_fffffffffffffb4e.ucs,in_stack_fffffffffffffb48));
      local_1c0 = (_Base_ptr)pVar7.first._M_node;
      uVar5 = pVar7.second;
      puVar11 = &DAT_aaaaaaaaaaaaaaaa;
      local_1b8 = uVar5;
      local_e8._M_node = local_1c0;
      local_d8 = local_1c0;
      local_d0 = uVar5;
      ppVar4 = std::_Rb_tree_iterator<std::pair<const_QString,_QMimeBinaryProvider::MimeTypeExtra>_>
               ::operator->((_Rb_tree_iterator<std::pair<const_QString,_QMimeBinaryProvider::MimeTypeExtra>_>
                             *)0x8fbd71);
      local_1d8 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_1d0 = &DAT_aaaaaaaaaaaaaaaa;
      local_1c8 = puVar11;
      QString::QString((QString *)0x8fbdac);
      local_1e0 = puVar11;
      QXmlStreamReader::QXmlStreamReader
                ((QXmlStreamReader *)in_stack_fffffffffffffb50,
                 (QIODevice *)CONCAT26(in_stack_fffffffffffffb4e.ucs,in_stack_fffffffffffffb48));
      bVar1 = QXmlStreamReader::readNextStartElement
                        ((QXmlStreamReader *)
                         CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28));
      if (bVar1) {
        QVar8 = QXmlStreamReader::name
                          ((QXmlStreamReader *)
                           CONCAT26(in_stack_fffffffffffffb4e.ucs,in_stack_fffffffffffffb48));
        local_1f0 = QVar8;
        local_200 = Qt::Literals::StringLiterals::operator____L1
                              ((char *)in_stack_fffffffffffffb38,
                               CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30));
        bVar1 = ::operator!=((QStringView *)
                             CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30),
                             (QLatin1StringView *)
                             CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28));
        if (bVar1) {
          local_e0._M_node =
               (_Base_ptr)
               std::
               map<QString,_QMimeBinaryProvider::MimeTypeExtra,_std::less<QString>,_std::allocator<std::pair<const_QString,_QMimeBinaryProvider::MimeTypeExtra>_>_>
               ::cend((map<QString,_QMimeBinaryProvider::MimeTypeExtra,_std::less<QString>,_std::allocator<std::pair<const_QString,_QMimeBinaryProvider::MimeTypeExtra>_>_>
                       *)CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28));
          bVar1 = true;
        }
        else {
          local_218.m_data = (storage_type_conflict *)&DAT_aaaaaaaaaaaaaaaa;
          local_218.m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
          QXmlStreamReader::attributes((QXmlStreamReader *)in_stack_fffffffffffffb38);
          Qt::Literals::StringLiterals::operator____L1
                    ((char *)in_stack_fffffffffffffb38,
                     CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30));
          str.m_size._7_1_ = in_stack_fffffffffffffb47;
          str.m_size._0_7_ = in_stack_fffffffffffffb40;
          str.m_data._0_6_ = in_stack_fffffffffffffb48;
          str.m_data._6_2_ = in_stack_fffffffffffffb4e.ucs;
          QAnyStringView::QAnyStringView((QAnyStringView *)in_stack_fffffffffffffb38,str);
          qualifiedName.m_size._0_7_ = in_stack_fffffffffffffbb8;
          qualifiedName.field_0 = (anon_union_8_3_8ad491a7_for_QAnyStringView_6)puVar11;
          qualifiedName.m_size._7_1_ = uVar5;
          local_218 = QXmlStreamAttributes::value(in_stack_fffffffffffffb80,qualifiedName);
          QXmlStreamAttributes::~QXmlStreamAttributes((QXmlStreamAttributes *)0x8fbf69);
          bVar1 = QStringView::isEmpty((QStringView *)0x8fbf76);
          if (!bVar1) {
            QStringView::QStringView<QString,_true>
                      ((QStringView *)CONCAT17(in_stack_fffffffffffffb47,in_stack_fffffffffffffb40),
                       (QString *)in_stack_fffffffffffffb38);
            QVar9.m_data = (storage_type_conflict *)in_stack_fffffffffffffb58;
            QVar9.m_size = (qsizetype)in_stack_fffffffffffffb50;
            iVar3 = QStringView::compare
                              ((QStringView *)
                               CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28),QVar9,
                               CaseInsensitive);
            if (iVar3 != 0) {
              QMessageLogger::QMessageLogger
                        ((QMessageLogger *)
                         CONCAT17(in_stack_fffffffffffffb47,in_stack_fffffffffffffb40),
                         (char *)in_stack_fffffffffffffb38,in_stack_fffffffffffffb34,
                         (char *)CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28));
              QMessageLogger::warning
                        ((QMessageLogger *)
                         CONCAT26(in_stack_fffffffffffffb4e.ucs,in_stack_fffffffffffffb48));
              QDebug::operator<<(in_stack_fffffffffffffb58,(char *)in_stack_fffffffffffffb88);
              local_288 = local_218.m_size;
              psStack_280 = local_218.m_data;
              s.m_data = (storage_type_conflict *)in_stack_fffffffffffffb58;
              s.m_size = (qsizetype)in_stack_fffffffffffffb50;
              in_stack_fffffffffffffb88 =
                   QDebug::operator<<((QDebug *)
                                      CONCAT26(in_stack_fffffffffffffb4e.ucs,
                                               in_stack_fffffffffffffb48),s);
              in_stack_fffffffffffffb80 =
                   (QXmlStreamAttributes *)
                   QDebug::operator<<(in_stack_fffffffffffffb58,(char *)in_stack_fffffffffffffb88);
              this_00 = QDebug::operator<<((QDebug *)
                                           CONCAT17(in_stack_fffffffffffffb47,
                                                    in_stack_fffffffffffffb40),
                                           (QString *)in_stack_fffffffffffffb38);
              QDebug::operator<<(in_stack_fffffffffffffb58,(char *)in_stack_fffffffffffffb88);
              QDebug::operator<<((QDebug *)
                                 CONCAT17(in_stack_fffffffffffffb47,in_stack_fffffffffffffb40),
                                 (QString *)in_stack_fffffffffffffb38);
              QDebug::~QDebug(this_00);
            }
            while( true ) {
              bVar1 = QXmlStreamReader::readNextStartElement
                                ((QXmlStreamReader *)
                                 CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28));
              if (!bVar1) break;
              local_298.m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
              local_298.m_data = (storage_type_conflict *)&DAT_aaaaaaaaaaaaaaaa;
              QVar9 = QXmlStreamReader::name
                                ((QXmlStreamReader *)
                                 CONCAT26(in_stack_fffffffffffffb4e.ucs,in_stack_fffffffffffffb48));
              local_298 = QVar9;
              local_2a8 = Qt::Literals::StringLiterals::operator____L1
                                    ((char *)in_stack_fffffffffffffb38,
                                     CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30));
              bVar1 = ::operator==((QStringView *)
                                   CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30),
                                   (QLatin1StringView *)
                                   CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28));
              if (bVar1) {
                local_2c8 = &DAT_aaaaaaaaaaaaaaaa;
                puStack_2c0 = &DAT_aaaaaaaaaaaaaaaa;
                local_2b8 = &DAT_aaaaaaaaaaaaaaaa;
                QXmlStreamReader::attributes((QXmlStreamReader *)in_stack_fffffffffffffb38);
                Qt::Literals::StringLiterals::operator____L1
                          ((char *)in_stack_fffffffffffffb38,
                           CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30));
                str_00.m_size._7_1_ = in_stack_fffffffffffffb47;
                str_00.m_size._0_7_ = in_stack_fffffffffffffb40;
                str_00.m_data._0_6_ = in_stack_fffffffffffffb48;
                str_00.m_data._6_2_ = in_stack_fffffffffffffb4e.ucs;
                QAnyStringView::QAnyStringView((QAnyStringView *)in_stack_fffffffffffffb38,str_00);
                qualifiedName_00.m_size._0_7_ = in_stack_fffffffffffffbb8;
                qualifiedName_00.field_0 = (anon_union_8_3_8ad491a7_for_QAnyStringView_6)puVar11;
                qualifiedName_00.m_size._7_1_ = uVar5;
                local_2d8 = QXmlStreamAttributes::value(in_stack_fffffffffffffb80,qualifiedName_00);
                QStringView::toString
                          ((QStringView *)
                           CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30));
                QXmlStreamAttributes::~QXmlStreamAttributes((QXmlStreamAttributes *)0x8fc25b);
                local_308 = &DAT_aaaaaaaaaaaaaaaa;
                local_318 = &DAT_aaaaaaaaaaaaaaaa;
                puStack_310 = &DAT_aaaaaaaaaaaaaaaa;
                QXmlStreamReader::readElementText
                          ((QXmlStreamReader *)QVar8.m_size,QVar8.m_data._4_4_);
                bVar1 = QString::isEmpty((QString *)0x8fc2a2);
                if (bVar1) {
                  Qt::Literals::StringLiterals::operator____L1
                            ((char *)in_stack_fffffffffffffb38,
                             CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30));
                  other.m_data = (char *)in_stack_fffffffffffffb88;
                  other.m_size = (qsizetype)in_stack_fffffffffffffb80;
                  QString::operator=((QString *)QVar9.m_size,other);
                }
                iVar10 = QHash<QString,_QString>::insert
                                   ((QHash<QString,_QString> *)
                                    CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30),
                                    (QString *)
                                    CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28),
                                    (QString *)0x8fc378);
                in_stack_fffffffffffffb48 = (undefined6)iVar10.i.bucket;
                in_stack_fffffffffffffb4e.ucs = iVar10.i.bucket._6_2_;
                QString::~QString((QString *)0x8fc3b6);
                QString::~QString((QString *)0x8fc3c3);
              }
              else {
                local_328 = Qt::Literals::StringLiterals::operator____L1
                                      ((char *)in_stack_fffffffffffffb38,
                                       CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30)
                                      );
                bVar1 = ::operator==((QStringView *)
                                     CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30),
                                     (QLatin1StringView *)
                                     CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28));
                if (bVar1) {
                  (ppVar4->second).hasGlobDeleteAll = true;
                }
                else {
                  local_338 = Qt::Literals::StringLiterals::operator____L1
                                        ((char *)in_stack_fffffffffffffb38,
                                         CONCAT44(in_stack_fffffffffffffb34,
                                                  in_stack_fffffffffffffb30));
                  bVar1 = ::operator==((QStringView *)
                                       CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30)
                                       ,(QLatin1StringView *)
                                        CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28
                                                ));
                  if (bVar1) {
                    local_358 = &DAT_aaaaaaaaaaaaaaaa;
                    puStack_350 = &DAT_aaaaaaaaaaaaaaaa;
                    local_348 = &DAT_aaaaaaaaaaaaaaaa;
                    QXmlStreamReader::attributes((QXmlStreamReader *)in_stack_fffffffffffffb38);
                    Qt::Literals::StringLiterals::operator____L1
                              ((char *)in_stack_fffffffffffffb38,
                               CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30));
                    str_01.m_size._7_1_ = in_stack_fffffffffffffb47;
                    str_01.m_size._0_7_ = in_stack_fffffffffffffb40;
                    str_01.m_data._0_6_ = in_stack_fffffffffffffb48;
                    str_01.m_data._6_2_ = in_stack_fffffffffffffb4e.ucs;
                    QAnyStringView::QAnyStringView
                              ((QAnyStringView *)in_stack_fffffffffffffb38,str_01);
                    qualifiedName_01.m_size._0_7_ = in_stack_fffffffffffffbb8;
                    qualifiedName_01.field_0 = (anon_union_8_3_8ad491a7_for_QAnyStringView_6)puVar11
                    ;
                    qualifiedName_01.m_size._7_1_ = uVar5;
                    local_368 = QXmlStreamAttributes::value
                                          (in_stack_fffffffffffffb80,qualifiedName_01);
                    QStringView::toString
                              ((QStringView *)
                               CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30));
                    QXmlStreamAttributes::~QXmlStreamAttributes((QXmlStreamAttributes *)0x8fc52d);
                    bVar1 = QString::isEmpty((QString *)0x8fc53a);
                    if (bVar1) {
                      QChar::QChar<char16_t,_true>(local_392,L'*');
                      in_stack_fffffffffffffb47 =
                           QString::startsWith((QString *)in_stack_fffffffffffffb38,
                                               in_stack_fffffffffffffb4e,in_stack_fffffffffffffb34);
                      if ((bool)in_stack_fffffffffffffb47) {
                        QString::operator=((QString *)
                                           CONCAT44(in_stack_fffffffffffffb34,
                                                    in_stack_fffffffffffffb30),
                                           (QString *)
                                           CONCAT44(in_stack_fffffffffffffb2c,
                                                    in_stack_fffffffffffffb28));
                      }
                    }
                    appendIfNew((QStringList *)
                                CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30),
                                (QString *)
                                CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28));
                    QString::~QString((QString *)0x8fc612);
                  }
                }
                QXmlStreamReader::skipCurrentElement
                          ((QXmlStreamReader *)
                           CONCAT17(in_stack_fffffffffffffb47,in_stack_fffffffffffffb40));
              }
            }
            goto LAB_008fc62c;
          }
          local_e0._M_node =
               (_Base_ptr)
               std::
               map<QString,_QMimeBinaryProvider::MimeTypeExtra,_std::less<QString>,_std::allocator<std::pair<const_QString,_QMimeBinaryProvider::MimeTypeExtra>_>_>
               ::cend((map<QString,_QMimeBinaryProvider::MimeTypeExtra,_std::less<QString>,_std::allocator<std::pair<const_QString,_QMimeBinaryProvider::MimeTypeExtra>_>_>
                       *)CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28));
          bVar1 = true;
        }
      }
      else {
LAB_008fc62c:
        bVar1 = QString::isEmpty((QString *)0x8fc639);
        if (!bVar1) {
          bVar1 = QList<QString>::isEmpty((QList<QString> *)0x8fc64e);
          if (!bVar1) {
            QList<QString>::constFirst
                      ((QList<QString> *)
                       CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30));
            bVar1 = ::operator!=((QString *)
                                 CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30),
                                 (QString *)
                                 CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28));
            if (!bVar1) goto LAB_008fc6b1;
          }
          QList<QString>::removeAll<QString>
                    ((QList<QString> *)CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30)
                     ,(QString *)CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28));
          QList<QString>::prepend
                    ((QList<QString> *)CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30)
                     ,(parameter_type)CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28))
          ;
        }
LAB_008fc6b1:
        bVar1 = false;
      }
      QXmlStreamReader::~QXmlStreamReader
                ((QXmlStreamReader *)CONCAT17(in_stack_fffffffffffffb47,in_stack_fffffffffffffb40));
      QString::~QString((QString *)0x8fc6d6);
    }
    QFile::~QFile((QFile *)0x8fc6e3);
    QString::~QString((QString *)0x8fc6f0);
    if (bVar1) goto LAB_008fc74c;
  }
  std::_Rb_tree_const_iterator<std::pair<const_QString,_QMimeBinaryProvider::MimeTypeExtra>_>::
  _Rb_tree_const_iterator(&local_e0,&local_e8);
LAB_008fc74c:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (const_iterator)local_e0._M_node;
}

Assistant:

QMimeBinaryProvider::MimeTypeExtraMap::const_iterator
QMimeBinaryProvider::loadMimeTypeExtra(const QString &mimeName)
{
#if QT_CONFIG(xmlstreamreader)
    auto it = m_mimetypeExtra.find(mimeName);
    if (it == m_mimetypeExtra.cend()) {
        // load comment and globPatterns

        // shared-mime-info since 1.3 lowercases the xml files
        QString mimeFile = m_directory + u'/' + mimeName.toLower() + ".xml"_L1;
        if (!QFile::exists(mimeFile))
            mimeFile = m_directory + u'/' + mimeName + ".xml"_L1; // pre-1.3

        QFile qfile(mimeFile);
        if (!qfile.open(QFile::ReadOnly))
            return m_mimetypeExtra.cend();

        it = m_mimetypeExtra.try_emplace(mimeName).first;
        MimeTypeExtra &extra = it->second;
        QString mainPattern;

        QXmlStreamReader xml(&qfile);
        if (xml.readNextStartElement()) {
            if (xml.name() != "mime-type"_L1) {
                return m_mimetypeExtra.cend();
            }
            const auto name = xml.attributes().value("type"_L1);
            if (name.isEmpty())
                return m_mimetypeExtra.cend();
            if (name.compare(mimeName, Qt::CaseInsensitive))
                qWarning() << "Got name" << name << "in file" << mimeFile << "expected" << mimeName;

            while (xml.readNextStartElement()) {
                const auto tag = xml.name();
                if (tag == "comment"_L1) {
                    QString lang = xml.attributes().value("xml:lang"_L1).toString();
                    const QString text = xml.readElementText();
                    if (lang.isEmpty()) {
                        lang = "default"_L1; // no locale attribute provided, treat it as default.
                    }
                    extra.localeComments.insert(lang, text);
                    continue; // we called readElementText, so we're at the EndElement already.
                } else if (tag == "glob-deleteall"_L1) { // as written out by shared-mime-info >= 0.70
                    extra.hasGlobDeleteAll = true;
                } else if (tag == "glob"_L1) { // as written out by shared-mime-info >= 0.70
                    const QString pattern = xml.attributes().value("pattern"_L1).toString();
                    if (mainPattern.isEmpty() && pattern.startsWith(u'*')) {
                        mainPattern = pattern;
                    }
                    appendIfNew(extra.globPatterns, pattern);
                }
                xml.skipCurrentElement();
            }
            Q_ASSERT(xml.name() == "mime-type"_L1);
        }

        // Let's assume that shared-mime-info is at least version 0.70
        // Otherwise we would need 1) a version check, and 2) code for parsing patterns from the globs file.
        if (!mainPattern.isEmpty() &&
                (extra.globPatterns.isEmpty() || extra.globPatterns.constFirst() != mainPattern)) {
            // ensure it's first in the list of patterns
            extra.globPatterns.removeAll(mainPattern);
            extra.globPatterns.prepend(mainPattern);
        }
    }
    return it;
#else
    Q_UNUSED(mimeName);
    qWarning("Cannot load mime type since QXmlStreamReader is not available.");
    return m_mimetypeExtra.cend();
#endif // feature xmlstreamreader
}